

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O2

void mi_free(void *p)

{
  uint uVar1;
  long lVar2;
  mi_block_t *block;
  ulong uVar3;
  mi_segment_t *segment;
  mi_page_t *page;
  mi_threadid_t *in_FS_OFFSET;
  
  segment = (mi_segment_t *)((long)p - 1U & 0xfffffffffe000000);
  if ((long)segment < 1) {
    return;
  }
  uVar3 = (ulong)((long)p - (long)segment) >> 0x10;
  uVar1 = segment->slices[uVar3].slice_offset;
  lVar2 = uVar3 * 0x60 - (ulong)uVar1;
  page = (mi_page_t *)((long)segment + lVar2 + 0x120);
  if (segment->thread_id == *in_FS_OFFSET) {
    if (*(char *)((long)segment + lVar2 + 0x12e) == '\0') {
      mi_free_block_local(page,(mi_block_t *)p,false,SUB41(uVar1,0));
      return;
    }
    mi_free_generic_local(page,(mi_segment_t *)p,p);
    return;
  }
  block = _mi_page_ptr_unalign(page,p);
  mi_free_block_mt(page,segment,block);
  return;
}

Assistant:

static inline mi_segment_t* _mi_ptr_segment(const void* p) {
  mi_segment_t* const segment = (mi_segment_t*)(((uintptr_t)p - 1) & ~MI_SEGMENT_MASK);
  #if MI_INTPTR_SIZE <= 4
  return (p==NULL ? NULL : segment);
  #else
  return ((intptr_t)segment <= 0 ? NULL : segment);
  #endif
}